

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

cmNinjaRule *
anon_unknown.dwarf_ea7c86::GetScanRule
          (cmNinjaRule *__return_storage_ptr__,string *ruleName,string *ppFileName,string *deptype,
          RuleVariables *vars,string *responseFlag,string *flags,
          cmRulePlaceholderExpander *rulePlaceholderExpander,cmLocalNinjaGenerator *generator,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *scanCmds,string *outputConfig)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  bool bVar1;
  ulong uVar2;
  basic_string_view<char,_std::char_traits<char>_> __y;
  cmOutputConverter *local_3b8;
  string local_378;
  string local_358;
  reference local_338;
  string *scanCmd;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  cmAlphaNum local_2e8;
  string local_2b8;
  char local_292 [2];
  cmAlphaNum local_290;
  cmAlphaNum local_260;
  string local_230;
  undefined1 local_210 [8];
  string scanFlags;
  RuleVariables scanVars;
  string local_60;
  byte local_39;
  string *local_38;
  string *responseFlag_local;
  RuleVariables *vars_local;
  string *deptype_local;
  string *ppFileName_local;
  string *ruleName_local;
  cmNinjaRule *rule;
  
  local_39 = 0;
  local_38 = responseFlag;
  responseFlag_local = (string *)vars;
  vars_local = (RuleVariables *)deptype;
  deptype_local = ppFileName;
  ppFileName_local = ruleName;
  ruleName_local = &__return_storage_ptr__->Name;
  std::__cxx11::string::string((string *)&local_60,(string *)ruleName);
  cmNinjaRule::cmNinjaRule(__return_storage_ptr__,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
        std::__cxx11::string::operator_cast_to_basic_string_view((string *)vars_local);
  __y = (basic_string_view<char,_std::char_traits<char>_>)::cm::operator____s("msvc",4);
  scanVars.Launcher = (char *)__y._M_len;
  bVar1 = std::operator==(__x,__y);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->DepType,(string *)vars_local)
    ;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->DepFile,"");
  }
  else {
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->DepType,"");
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->DepFile,"$DEP_FILE");
  }
  cmRulePlaceholderExpander::RuleVariables::RuleVariables
            ((RuleVariables *)((long)&scanFlags.field_2 + 8));
  scanFlags.field_2._8_8_ = *(undefined8 *)responseFlag_local;
  scanVars.CMTargetName = (char *)responseFlag_local->_M_string_length;
  scanVars.TargetVersionMinor = (char *)responseFlag_local[1].field_2._M_allocated_capacity;
  scanVars.Output = "$OBJ_FILE";
  scanVars.AssemblySource = (char *)std::__cxx11::string::c_str();
  scanVars.PreprocessedSource = "$DYNDEP_INTERMEDIATE_FILE";
  scanVars.Includes = (char *)std::__cxx11::string::c_str();
  scanVars.DependencyFile = "$out";
  scanVars.LinkLibraries = *(char **)((long)&responseFlag_local[2].field_2 + 8);
  scanVars.LanguageCompileFlags = *(char **)((long)&responseFlag_local[6].field_2 + 8);
  scanVars.Defines = *(char **)(responseFlag_local + 7);
  std::__cxx11::string::string((string *)local_210,(string *)flags);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->RspFile,"$RSP_FILE");
    cmAlphaNum::cmAlphaNum(&local_260,' ');
    cmAlphaNum::cmAlphaNum(&local_290,scanVars.LanguageCompileFlags);
    local_292[1] = 0x20;
    local_292[0] = ' ';
    cmStrCat<char,char_const*,char,std::__cxx11::string>
              (&local_230,&local_260,&local_290,local_292 + 1,&scanVars.Defines,local_292,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210);
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->RspContent,(string *)&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    cmAlphaNum::cmAlphaNum(&local_2e8,local_38);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&__range1,&__return_storage_ptr__->RspFile);
    cmStrCat<>(&local_2b8,&local_2e8,(cmAlphaNum *)&__range1);
    std::__cxx11::string::operator=((string *)local_210,(string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    scanVars.LanguageCompileFlags = "";
    scanVars.Defines = "";
  }
  scanVars.ObjectFileDir = (char *)std::__cxx11::string::c_str();
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(scanCmds);
  scanCmd = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(scanCmds);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&scanCmd);
    if (!bVar1) break;
    local_338 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1);
    local_3b8 = (cmOutputConverter *)0x0;
    if (generator != (cmLocalNinjaGenerator *)0x0) {
      local_3b8 = &(generator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                   super_cmOutputConverter;
    }
    cmRulePlaceholderExpander::ExpandRuleVariables
              (rulePlaceholderExpander,local_3b8,local_338,
               (RuleVariables *)((long)&scanFlags.field_2 + 8));
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::string((string *)&local_378);
  cmLocalNinjaGenerator::BuildCommandLine
            (&local_358,generator,scanCmds,outputConfig,outputConfig,&local_378,
             (cmGeneratorTarget *)0x0);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->Command,(string *)&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_378);
  local_39 = 1;
  std::__cxx11::string::~string((string *)local_210);
  if ((local_39 & 1) == 0) {
    cmNinjaRule::~cmNinjaRule(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

cmNinjaRule GetScanRule(
  std::string const& ruleName, std::string const& ppFileName,
  std::string const& deptype,
  cmRulePlaceholderExpander::RuleVariables const& vars,
  const std::string& responseFlag, const std::string& flags,
  cmRulePlaceholderExpander* const rulePlaceholderExpander,
  cmLocalNinjaGenerator* generator, std::vector<std::string> scanCmds,
  const std::string& outputConfig)
{
  cmNinjaRule rule(ruleName);
  // Scanning always uses a depfile for preprocessor dependencies.
  if (deptype == "msvc"_s) {
    rule.DepType = deptype;
    rule.DepFile = "";
  } else {
    rule.DepType = ""; // no deps= for multiple outputs
    rule.DepFile = "$DEP_FILE";
  }

  cmRulePlaceholderExpander::RuleVariables scanVars;
  scanVars.CMTargetName = vars.CMTargetName;
  scanVars.CMTargetType = vars.CMTargetType;
  scanVars.Language = vars.Language;
  scanVars.Object = "$OBJ_FILE";
  scanVars.PreprocessedSource = ppFileName.c_str();
  scanVars.DynDepFile = "$DYNDEP_INTERMEDIATE_FILE";
  scanVars.DependencyFile = rule.DepFile.c_str();
  scanVars.DependencyTarget = "$out";

  // Scanning needs the same preprocessor settings as direct compilation would.
  scanVars.Source = vars.Source;
  scanVars.Defines = vars.Defines;
  scanVars.Includes = vars.Includes;

  // Scanning needs the compilation flags too.
  std::string scanFlags = flags;

  // If using a response file, move defines, includes, and flags into it.
  if (!responseFlag.empty()) {
    rule.RspFile = "$RSP_FILE";
    rule.RspContent =
      cmStrCat(' ', scanVars.Defines, ' ', scanVars.Includes, ' ', scanFlags);
    scanFlags = cmStrCat(responseFlag, rule.RspFile);
    scanVars.Defines = "";
    scanVars.Includes = "";
  }

  scanVars.Flags = scanFlags.c_str();

  // Rule for scanning a source file.
  for (std::string& scanCmd : scanCmds) {
    rulePlaceholderExpander->ExpandRuleVariables(generator, scanCmd, scanVars);
  }
  rule.Command =
    generator->BuildCommandLine(scanCmds, outputConfig, outputConfig);

  return rule;
}